

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QString * __thiscall
QTzTimeZonePrivate::abbreviation
          (QString *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  Data local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  data(&local_48,this,atMSecsSinceEpoch);
  qVar3 = local_48.abbreviation.d.size;
  pcVar2 = local_48.abbreviation.d.ptr;
  pDVar1 = local_48.abbreviation.d.d;
  local_48.abbreviation.d.d = (Data *)0x0;
  local_48.abbreviation.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pcVar2;
  local_48.abbreviation.d.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::abbreviation(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).abbreviation;
}